

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowReadPeerValues(WindowCodeArg *p,int csr,int reg)

{
  int iVar1;
  Window *pWVar2;
  ExprList *pEVar3;
  Vdbe *p_00;
  int local_48;
  int local_40;
  int i;
  int iColOff;
  ExprList *pPart;
  Vdbe *v;
  ExprList *pOrderBy;
  Window *pMWin;
  int reg_local;
  int csr_local;
  WindowCodeArg *p_local;
  
  pWVar2 = p->pMWin;
  pEVar3 = pWVar2->pOrderBy;
  if (pEVar3 != (ExprList *)0x0) {
    p_00 = sqlite3GetVdbe(p->pParse);
    iVar1 = pWVar2->nBufferCol;
    if (pWVar2->pPartition == (ExprList *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = pWVar2->pPartition->nExpr;
    }
    for (local_40 = 0; local_40 < pEVar3->nExpr; local_40 = local_40 + 1) {
      sqlite3VdbeAddOp3(p_00,0x5e,csr,iVar1 + local_48 + local_40,reg + local_40);
    }
  }
  return;
}

Assistant:

static void windowReadPeerValues(
  WindowCodeArg *p,
  int csr,
  int reg
){
  Window *pMWin = p->pMWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  if( pOrderBy ){
    Vdbe *v = sqlite3GetVdbe(p->pParse);
    ExprList *pPart = pMWin->pPartition;
    int iColOff = pMWin->nBufferCol + (pPart ? pPart->nExpr : 0);
    int i;
    for(i=0; i<pOrderBy->nExpr; i++){
      sqlite3VdbeAddOp3(v, OP_Column, csr, iColOff+i, reg+i);
    }
  }
}